

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_deflateInit2(mz_streamp pStream,int level,int method,int window_bits,int mem_level,
                   int strategy)

{
  mz_uint mVar1;
  uint flags;
  tdefl_status tVar2;
  void *pPut_buf_user;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  mz_uint comp_flags;
  tdefl_compressor *pComp;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  mVar1 = tdefl_create_comp_flags_from_zip_params(in_ESI,in_ECX,in_R9D);
  flags = mVar1 | 0x2000;
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else if ((((in_EDX == 8) && (0 < in_R8D)) && (in_R8D < 10)) &&
          ((in_ECX == 0xf || (in_ECX == -0xf)))) {
    *(undefined4 *)(in_RDI + 0x58) = 0;
    *(undefined8 *)(in_RDI + 0x60) = 1;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined8 *)(in_RDI + 0x68) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
    if (*(long *)(in_RDI + 0x40) == 0) {
      *(code **)(in_RDI + 0x40) = tinyexr::miniz::def_alloc_func;
    }
    if (*(long *)(in_RDI + 0x48) == 0) {
      *(code **)(in_RDI + 0x48) = tinyexr::miniz::def_free_func;
    }
    pPut_buf_user = (void *)(**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x50),1,0x4df78);
    if (pPut_buf_user == (void *)0x0) {
      local_4 = -4;
    }
    else {
      *(void **)(in_RDI + 0x38) = pPut_buf_user;
      tVar2 = tdefl_init((tdefl_compressor *)CONCAT44(in_ECX,in_R8D),
                         (tdefl_put_buf_func_ptr)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                         pPut_buf_user,flags);
      if (tVar2 == TDEFL_STATUS_OKAY) {
        local_4 = 0;
      }
      else {
        mz_deflateEnd((mz_streamp)CONCAT44(flags,in_stack_ffffffffffffffc8));
        local_4 = -10000;
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int mz_deflateInit2(mz_streamp pStream, int level, int method, int window_bits,
                    int mem_level, int strategy) {
  tdefl_compressor *pComp;
  mz_uint comp_flags =
      TDEFL_COMPUTE_ADLER32 |
      tdefl_create_comp_flags_from_zip_params(level, window_bits, strategy);

  if (!pStream) return MZ_STREAM_ERROR;
  if ((method != MZ_DEFLATED) || ((mem_level < 1) || (mem_level > 9)) ||
      ((window_bits != MZ_DEFAULT_WINDOW_BITS) &&
       (-window_bits != MZ_DEFAULT_WINDOW_BITS)))
    return MZ_PARAM_ERROR;

  pStream->data_type = 0;
  pStream->adler = MZ_ADLER32_INIT;
  pStream->msg = NULL;
  pStream->reserved = 0;
  pStream->total_in = 0;
  pStream->total_out = 0;
  if (!pStream->zalloc) pStream->zalloc = def_alloc_func;
  if (!pStream->zfree) pStream->zfree = def_free_func;

  pComp = (tdefl_compressor *)pStream->zalloc(pStream->opaque, 1,
                                              sizeof(tdefl_compressor));
  if (!pComp) return MZ_MEM_ERROR;

  pStream->state = (struct mz_internal_state *)pComp;

  if (tdefl_init(pComp, NULL, NULL, comp_flags) != TDEFL_STATUS_OKAY) {
    mz_deflateEnd(pStream);
    return MZ_PARAM_ERROR;
  }

  return MZ_OK;
}